

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWLookat.h
# Opt level: O3

int __thiscall
COLLADAFW::Lookat::clone(Lookat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ObjectId OVar1;
  Real RVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x70);
  OVar1 = (this->super_Transformation).super_Animatable.mAnimationList.mObjectId;
  puVar3[1] = *(undefined8 *)&(this->super_Transformation).super_Animatable.mAnimationList;
  puVar3[2] = OVar1;
  puVar3[3] = (this->super_Transformation).super_Animatable.mAnimationList.mFileId;
  *(TransformationType *)(puVar3 + 4) = (this->super_Transformation).mTransformationType;
  *puVar3 = &PTR__Transformation_009b01c8;
  RVar2 = (this->mEyePosition).field_0.field_0.y;
  puVar3[5] = (this->mEyePosition).field_0.field_0.x;
  puVar3[6] = RVar2;
  RVar2 = (this->mInterestPointPosition).field_0.field_0.x;
  puVar3[7] = (this->mEyePosition).field_0.field_0.z;
  puVar3[8] = RVar2;
  RVar2 = (this->mInterestPointPosition).field_0.field_0.z;
  puVar3[9] = (this->mInterestPointPosition).field_0.field_0.y;
  puVar3[10] = RVar2;
  RVar2 = (this->mUpAxisDirection).field_0.field_0.y;
  puVar3[0xb] = (this->mUpAxisDirection).field_0.field_0.x;
  puVar3[0xc] = RVar2;
  puVar3[0xd] = (this->mUpAxisDirection).field_0.field_0.z;
  return (int)puVar3;
}

Assistant:

virtual Lookat* clone() const { return new Lookat(*this); }